

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test_tests.cpp
# Opt level: O1

int Test_x_iutest_x_ParamTest_TestSuiteInstantiationRegister(void)

{
  pointer pcVar1;
  UnitTest *pUVar2;
  string *psVar3;
  ParamTestSuiteInfo<ParamTest> *pPVar4;
  undefined1 local_78 [32];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pUVar2 = iutest::UnitTest::instance();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"ParamTest","");
  psVar3 = iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname__abi_cxx11_();
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar3->_M_string_length);
  pPVar4 = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<ParamTest>
                     (&pUVar2->m_param_testsuite_holder,(string *)local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Test","");
  local_78._0_8_ = s_Test_x_iutest_x_ParamTest_EvalGenerator_;
  local_78._8_8_ = s_Test_x_iutest_x_ParamTest_ParamGenerator__abi_cxx11_;
  local_78._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/list_test_tests.cpp"
  ;
  local_78._24_4_ = 0x20;
  std::
  vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>>>
  ::emplace_back<std::__cxx11::string&,iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>
            ((vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<ParamTest>::Functor>>>
              *)&pPVar4->m_instantiation,&local_38,(Functor *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, A)
{
}